

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

void __thiscall
kainjow::mustache::
context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::pop
          (context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  pointer __src;
  pointer *pppbVar1;
  pointer __dest;
  pointer ppbVar2;
  
  __dest = (this->items_).
           super__Vector_base<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppbVar2 = (this->items_).
            super__Vector_base<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __src = __dest + 1;
  if (__src != ppbVar2) {
    memmove(__dest,__src,(long)ppbVar2 - (long)__src);
  }
  pppbVar1 = &(this->items_).
              super__Vector_base<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  *pppbVar1 = *pppbVar1 + -1;
  return;
}

Assistant:

virtual void pop() override {
        items_.erase(items_.begin());
    }